

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O2

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isIllegalVertexOutput
               (VarType *varType,bool insideAStruct,bool insideAnArray)

{
  uint uVar1;
  Type TVar2;
  DataType DVar3;
  pointer pSVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  VarType *varType_00;
  
  for (; TVar2 = varType->m_type, TVar2 == TYPE_ARRAY; varType = (varType->m_data).array.elementType
      ) {
    if (((insideAStruct | insideAnArray) & 1U) != 0) {
      bVar8 = 1;
      goto LAB_013c6115;
    }
    insideAnArray = true;
    insideAStruct = false;
  }
  if (TVar2 == TYPE_BASIC) {
    DVar3 = (varType->m_data).basic.type;
    uVar1 = DVar3 - TYPE_FLOAT;
    if ((uVar1 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      bVar8 = (byte)(0x400000000 >> ((byte)uVar1 & 0x3f));
    }
    else {
      bVar8 = 1;
      if (2 < DVar3 - TYPE_BOOL_VEC2) {
        bVar8 = DVar3 - TYPE_INT < 0xfffffff7 && DVar3 - TYPE_DOUBLE < 0xfffffff7;
      }
    }
  }
  else {
    bVar8 = 1;
    if (((insideAnArray | insideAStruct) & 1U) == 0 && TVar2 == TYPE_STRUCT) {
      pSVar4 = (((varType->m_data).structPtr)->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(((varType->m_data).structPtr)->m_members).
                     super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) / 0x38;
      iVar6 = (int)uVar7;
      uVar9 = 0;
      uVar10 = 0;
      if (0 < iVar6) {
        uVar10 = uVar7 & 0xffffffff;
      }
      varType_00 = &pSVar4->m_type;
      do {
        if (uVar10 == uVar9) {
          bVar8 = (long)uVar9 < (long)iVar6;
          break;
        }
        bVar5 = isIllegalVertexOutput(varType_00,true,false);
        uVar9 = uVar9 + 1;
        varType_00 = (VarType *)&varType_00[2].m_data;
      } while (!bVar5);
    }
  }
LAB_013c6115:
  return (bool)(bVar8 & 1);
}

Assistant:

static bool isIllegalVertexOutput (const glu::VarType& varType, bool insideAStruct = false, bool insideAnArray = false)
{
	// booleans, opaque types, arrays of arrays, arrays of structs, array in struct, struct struct are not allowed as vertex outputs

	if (varType.isBasicType())
	{
		const bool isOpaqueType = !glu::isDataTypeScalar(varType.getBasicType()) && !glu::isDataTypeVector(varType.getBasicType()) && !glu::isDataTypeMatrix(varType.getBasicType());

		if (glu::isDataTypeBoolOrBVec(varType.getBasicType()))
			return true;

		if (isOpaqueType)
			return true;

		return false;
	}
	else if (varType.isArrayType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		return isIllegalVertexOutput(varType.getElementType(), insideAStruct, true);
	}
	else if (varType.isStructType())
	{
		if (insideAnArray || insideAStruct)
			return true;

		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isIllegalVertexOutput(varType.getStructPtr()->getMember(ndx).getType(), true, insideAnArray))
				return true;

		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}